

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTim.c
# Opt level: O0

void Gia_ManDupCollapse_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Man_t *pNew)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pNew_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar2 = Gia_ObjIsAnd(pObj);
    if (iVar2 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTim.c"
                    ,0x318,"void Gia_ManDupCollapse_rec(Gia_Man_t *, Gia_Obj_t *, Gia_Man_t *)");
    }
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Gia_ObjSibl(p,iVar2);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjId(p,pObj);
      pGVar5 = Gia_ObjSiblObj(p,iVar2);
      Gia_ManDupCollapse_rec(p,pGVar5,pNew);
    }
    pGVar5 = Gia_ObjFanin0(pObj);
    Gia_ManDupCollapse_rec(p,pGVar5,pNew);
    pGVar5 = Gia_ObjFanin1(pObj);
    Gia_ManDupCollapse_rec(p,pGVar5,pNew);
    iVar2 = Gia_ObjFanin0Copy(pObj);
    iVar3 = Gia_ObjFanin1Copy(pObj);
    uVar4 = Gia_ManHashAnd(pNew,iVar2,iVar3);
    pObj->Value = uVar4;
    iVar2 = Gia_ObjId(p,pObj);
    iVar2 = Gia_ObjSibl(p,iVar2);
    if (iVar2 != 0) {
      iVar2 = Gia_ObjId(p,pObj);
      pGVar5 = Gia_ObjSiblObj(p,iVar2);
      iVar2 = Abc_Lit2Var(pGVar5->Value);
      piVar1 = pNew->pSibls;
      iVar3 = Abc_Lit2Var(pObj->Value);
      piVar1[iVar3] = iVar2;
    }
  }
  return;
}

Assistant:

void Gia_ManDupCollapse_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Man_t * pNew )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        Gia_ManDupCollapse_rec( p, Gia_ObjSiblObj(p, Gia_ObjId(p, pObj)), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin0(pObj), pNew );
    Gia_ManDupCollapse_rec( p, Gia_ObjFanin1(pObj), pNew );
//    assert( !~pObj->Value );
    pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( Gia_ObjSibl(p, Gia_ObjId(p, pObj)) )
        pNew->pSibls[Abc_Lit2Var(pObj->Value)] = Abc_Lit2Var(Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))->Value);        
}